

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<double> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  int iVar1;
  size_type sVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  size_t __n;
  uint uVar5;
  uint uVar6;
  long lVar8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_7d [5];
  decimal_fp<double> local_78;
  significand_type *local_68;
  undefined1 local_5c [8];
  undefined4 uStack_54;
  significand_type **local_50;
  undefined8 local_48;
  undefined8 local_40;
  decimal_fp<double> *local_38;
  significand_type **local_30;
  int *local_28;
  ulong uVar7;
  
  local_68 = (significand_type *)fp->significand;
  local_78._12_4_ =
       (uint)*(ushort *)
              (bsr2log10(int)::data + (ulong)((uint)LZCOUNT((ulong)local_68 | 1) ^ 0x3f) * 2) -
       (uint)(local_68 <
             *(significand_type **)
              (basic_data<void>::zero_or_powers_of_10_64_new +
              (ulong)*(ushort *)
                      (bsr2log10(int)::data + (ulong)((uint)LZCOUNT((ulong)local_68 | 1) ^ 0x3f) * 2
                      ) * 8));
  local_78.significand._4_4_ = fspecs._4_4_;
  local_78.exponent = local_78.significand._4_4_ >> 8 & 0xff;
  local_7d[0] = decimal_point;
  local_78.significand = (significand_type)fspecs;
  if ((int)local_78._12_4_ < 0) goto LAB_0012d540;
  uVar6 = (local_78._12_4_ + 1) - (uint)(local_78.exponent == 0);
  uVar7 = (ulong)uVar6;
  iVar1 = fp->exponent;
  local_5c._0_4_ = iVar1 + local_78._12_4_;
  local_78.significand._0_4_ = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0012d309:
    iVar1 = iVar1 + -1 + local_78._12_4_;
    if ((local_78.significand._4_4_ >> 0x14 & 1) == 0) {
      uVar5 = 0;
      if (local_78._12_4_ == 1) {
        local_7d[0] = '\0';
        uVar5 = 0;
      }
    }
    else {
      uVar5 = ~((int)((uint)local_78.significand - local_78._12_4_) >> 0x1f) &
              (uint)local_78.significand - local_78._12_4_;
      uVar7 = (ulong)(uVar6 + uVar5);
    }
    iVar3 = 1 - local_5c._0_4_;
    if (0 < (int)local_5c._0_4_) {
      iVar3 = iVar1;
    }
    lVar8 = 2;
    if (99 < iVar3) {
      lVar8 = (ulong)(999 < iVar3) + 3;
    }
    sVar4 = (3 - (ulong)(local_7d[0] == '\0')) + uVar7 + lVar8;
    stack0xffffffffffffffa8 =
         (int *)(CONCAT44(uStack_54,local_78.significand._4_4_ >> 8) & 0xffffffff000000ff);
    local_48._0_5_ = CONCAT14(local_7d[0],local_78._12_4_);
    local_40 = (decimal_fp<double> *)
               (CONCAT35(local_40._5_3_,
                         CONCAT14(((local_78.significand._4_4_ >> 0x10 & 1) == 0) << 5,uVar5)) |
               0x4500000000);
    local_38 = (decimal_fp<double> *)CONCAT44(local_38._4_4_,iVar1);
    local_50 = (significand_type **)local_68;
    if (specs->width < 1) {
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (out.container,sVar4 + sVar2,'\0');
      pcVar9 = ((out.container)->_M_dataplus)._M_p + sVar2;
      if (((ulong)stack0xffffffffffffffa8 & 0xffffffff) != 0) {
        *pcVar9 = *(char *)((long)&basic_data<void>::signs +
                           ((ulong)stack0xffffffffffffffa8 & 0xffffffff));
        pcVar9 = pcVar9 + 1;
      }
      __s = write_significand<char,_unsigned_long,_0>
                      (pcVar9,(unsigned_long)local_50,(int)local_48,1,local_48._4_1_);
      __n = (size_t)(int)local_40;
      pcVar9 = __s;
      if (0 < (long)__n) {
        pcVar9 = __s + __n;
        memset(__s,0x30,__n);
      }
      *pcVar9 = local_40._4_1_;
      write_exponent<char,char*>((int)local_38,pcVar9 + 1);
    }
    else {
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                      (out,specs,sVar4,sVar4,(anon_class_40_7_ef14d3db *)(local_5c + 4));
    }
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar5 = 0x10;
      if (0 < (int)(uint)local_78.significand) {
        uVar5 = (uint)local_78.significand;
      }
      if (((int)local_5c._0_4_ < -3) || ((int)uVar5 < (int)local_5c._0_4_)) goto LAB_0012d309;
    }
    if (iVar1 < 0) {
      if ((int)local_5c._0_4_ < 1) {
        uVar6 = -local_5c._0_4_;
        local_7d._1_4_ = uVar6;
        if (SBORROW4((uint)local_78.significand,uVar6) !=
            (int)((uint)local_78.significand + local_5c._0_4_) < 0) {
          local_7d._1_4_ = (uint)local_78.significand;
        }
        if ((int)(uint)local_78.significand < 0) {
          local_7d._1_4_ = uVar6;
        }
        if (local_78._12_4_ != 0) {
          local_7d._1_4_ = uVar6;
        }
        if ((int)local_7d._1_4_ < 0) {
LAB_0012d540:
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                      ,0x146,"negative value");
        }
        sVar4 = (ulong)(uint)local_7d._1_4_ + 2 + uVar7;
        unique0x00004e80 = &local_78.exponent;
        local_50 = (significand_type **)((long)local_7d + 1);
        local_48 = (int *)&local_78.field_0xc;
        local_40 = &local_78;
        local_38 = (decimal_fp<double> *)local_7d;
        local_30 = &local_68;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                        (out,specs,sVar4,sVar4,(anon_class_48_6_9afe1116 *)(local_5c + 4));
      }
      else {
        local_7d._1_4_ =
             (uint)local_78.significand - local_78._12_4_ &
             (int)(local_78.significand._4_4_ << 0xb) >> 0x1f;
        local_30 = (significand_type **)((long)local_7d + 1);
        sVar4 = (ulong)(uint)(~((int)local_7d._1_4_ >> 0x1f) & local_7d._1_4_) + 1 + uVar7;
        unique0x00004e80 = &local_78.exponent;
        local_50 = &local_68;
        local_48 = (int *)&local_78.field_0xc;
        local_40 = (decimal_fp<double> *)local_5c;
        local_38 = (decimal_fp<double> *)local_7d;
        out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar4,sVar4,(anon_class_48_6_48d028d1 *)(local_5c + 4));
      }
    }
    else {
      sVar4 = (size_t)(iVar1 + uVar6);
      local_7d._1_4_ = (uint)local_78.significand - local_5c._0_4_;
      if ((local_78.significand._4_4_ >> 0x14 & 1) != 0) {
        if ((fspecs._4_1_ != '\x02') && ((int)local_7d._1_4_ < 1)) {
          local_7d._1_4_ = 1;
        }
        if (0 < (long)(int)local_7d._1_4_) {
          sVar4 = sVar4 + (long)(int)local_7d._1_4_;
        }
      }
      unique0x00004e80 = &local_78.exponent;
      local_50 = &local_68;
      local_48 = (int *)&local_78.field_0xc;
      local_38 = &local_78;
      local_30 = (significand_type **)local_7d;
      local_28 = (int *)((long)local_7d + 1);
      local_40 = fp;
      out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                      (out,specs,sVar4,sVar4,(anon_class_56_7_a2a26a24 *)(local_5c + 4));
    }
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}